

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O0

real3 sdf_tools::flip3<sdf_tools::real3>(real3 *v0,IntFlipMap *map)

{
  real3 rVar1;
  const_reference pvVar2;
  real rVar3;
  anon_class_8_1_3fcf6738 getComp;
  size_type in_stack_ffffffffffffffb8;
  array<int,_3UL> *in_stack_ffffffffffffffc0;
  array<int,_3UL> *this;
  array<int,_3UL> local_28 [2];
  real local_c;
  real rStack_8;
  
  pvVar2 = std::array<int,_3UL>::operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  this = local_28;
  local_c = flip3<sdf_tools::real3>::anon_class_8_1_3fcf6738::operator()
                      ((anon_class_8_1_3fcf6738 *)this,(char)*pvVar2);
  pvVar2 = std::array<int,_3UL>::operator[](this,in_stack_ffffffffffffffb8);
  rStack_8 = flip3<sdf_tools::real3>::anon_class_8_1_3fcf6738::operator()
                       ((anon_class_8_1_3fcf6738 *)this,(char)*pvVar2);
  pvVar2 = std::array<int,_3UL>::operator[](this,in_stack_ffffffffffffffb8);
  rVar3 = flip3<sdf_tools::real3>::anon_class_8_1_3fcf6738::operator()
                    ((anon_class_8_1_3fcf6738 *)this,(char)*pvVar2);
  rVar1.y = rStack_8;
  rVar1.x = local_c;
  rVar1.z = rVar3;
  return rVar1;
}

Assistant:

inline T flip3(const T& v0, const IntFlipMap& map)
{

    auto getComp = [&](char c)
    {
        if      (c == 0) return v0.x;
        else if (c == 1) return v0.y;
        else             return v0.z;
    };

    return {getComp(map[0]),
            getComp(map[1]),
            getComp(map[2])};
}